

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_rotate_im(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 shift;
  TCGv_i32 X;
  uint left;
  uintptr_t o;
  uint uVar1;
  
  tcg_ctx = s->uc->tcg_ctx;
  left = insn & 0x100;
  uVar1 = 8;
  if ((insn & 0xe00) != 0) {
    uVar1 = insn >> 9 & 7;
  }
  shift = tcg_const_i32_m68k(tcg_ctx,uVar1);
  uVar1 = insn & 7;
  if ((insn & 8) == 0) {
    X = rotate32_x(tcg_ctx,tcg_ctx->cpu_dregs[uVar1],shift,left);
    rotate_x_flags(tcg_ctx,tcg_ctx->cpu_dregs[uVar1],X,0x20);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(X + (long)tcg_ctx));
  }
  else {
    rotate(tcg_ctx,tcg_ctx->cpu_dregs[uVar1],shift,left,0x20);
  }
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(shift + (long)tcg_ctx));
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(rotate_im)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv shift;
    int tmp;
    int left = (insn & 0x100);

    tmp = (insn >> 9) & 7;
    if (tmp == 0) {
        tmp = 8;
    }

    shift = tcg_const_i32(tcg_ctx, tmp);
    if (insn & 8) {
        rotate(tcg_ctx, DREG(insn, 0), shift, left, 32);
    } else {
        TCGv X = rotate32_x(tcg_ctx, DREG(insn, 0), shift, left);
        rotate_x_flags(tcg_ctx, DREG(insn, 0), X, 32);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, shift);

    set_cc_op(s, CC_OP_FLAGS);
}